

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pob-2250-rb.c
# Opt level: O1

void main_cold_2(void)

{
  fwrite("Usage: ./pob [-s address] [-p port] [-b size] [-q]",0x32,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t-s address : destination address (default 0.0.0.0)\n",0x34,1,_stderr);
  fwrite("\t-p port    : destination port (default 1500)\n",0x2e,1,_stderr);
  fwrite("\t-b size    : maximal number of packets in buffer (default 128)\n",0x40,1,_stderr);
  fwrite("\t-q         : quiet\n",0x14,1,_stderr);
  return;
}

Assistant:

static void usage(void) {
  fprintf(stderr, "Usage: ./pob [-s address] [-p port] [-b size] [-q]");
#ifdef WITH_OPENSSL
  fprintf(stderr, "[-c cert]");
#endif
  fprintf(stderr, "\n");
  fprintf(stderr, "\t-s address : destination address (default 0.0.0.0)\n");
  fprintf(stderr, "\t-p port    : destination port (default 1500)\n");
  fprintf(stderr, "\t-b size    : maximal number of packets in buffer (default 128)\n");
  fprintf(stderr, "\t-q         : quiet\n");

#ifdef WITH_OPENSSL
  fprintf(stderr, "\t-c cert    : verify packets with rsa certificate\n");
#endif
}